

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_struct.h
# Opt level: O0

void psa_set_key_type(psa_key_attributes_t *attributes,psa_key_type_t type)

{
  psa_key_type_t type_local;
  psa_key_attributes_t *attributes_local;
  
  if (attributes->domain_parameters == (void *)0x0) {
    (attributes->core).type = type;
  }
  else {
    psa_set_key_domain_parameters(attributes,type,(uint8_t *)0x0,0);
  }
  return;
}

Assistant:

static inline void psa_set_key_type(psa_key_attributes_t *attributes,
                                    psa_key_type_t type)
{
    if( attributes->domain_parameters == NULL )
    {
        /* Common case: quick path */
        attributes->core.type = type;
    }
    else
    {
        /* Call the bigger function to free the old domain paramteres.
         * Ignore any errors which may arise due to type requiring
         * non-default domain parameters, since this function can't
         * report errors. */
        (void) psa_set_key_domain_parameters( attributes, type, NULL, 0 );
    }
}